

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O1

XXH64_hash_t XXH_INLINE_XXH3_64bits_withSeed(void *input,size_t len,XXH64_hash_t seed)

{
  byte bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  xxh_u8 *pxVar55;
  XXH64_hash_t XVar56;
  XXH64_hash_t in_RCX;
  ulong uVar57;
  uint uVar58;
  ulong uVar59;
  ulong uVar60;
  XXH3_accWidth_e in_R9D;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  undefined1 (*acc) [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  xxh_u8 secret [192];
  xxh_u64 acc_1 [8];
  undefined1 local_180 [3] [64];
  undefined1 local_c0 [2] [64];
  
  if (len < 0x11) {
    if (8 < len) {
      uVar57 = seed + 0x6782737bea4239b9 ^ *input;
      uVar59 = 0xaf56bc3b0996523a - seed ^ *(ulong *)((long)input + (len - 8));
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar59;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar57;
      uVar57 = (SUB168(auVar3 * auVar29,8) ^ SUB168(auVar3 * auVar29,0)) +
               len + uVar59 +
               (uVar57 >> 0x38 | (uVar57 & 0xff000000000000) >> 0x28 |
                (uVar57 & 0xff0000000000) >> 0x18 | (uVar57 & 0xff00000000) >> 8 |
                (uVar57 & 0xff000000) << 8 | (uVar57 & 0xff0000) << 0x18 | (uVar57 & 0xff00) << 0x28
               | uVar57 << 0x38);
      uVar57 = uVar57 >> 0x25 ^ uVar57;
      goto LAB_0010913d;
    }
    if (3 < len) {
      XVar56 = XXH3_len_4to8_64b((xxh_u8 *)input,len,(xxh_u8 *)seed,in_RCX);
      return XVar56;
    }
    if (len != 0) {
      XVar56 = XXH3_len_1to3_64b((xxh_u8 *)input,len,(xxh_u8 *)seed,in_RCX);
      return XVar56;
    }
    uVar57 = seed + 0x9e3779b185ebca87 ^ 0x8726f9105dc21ddc;
  }
  else {
    if (0x80 < len) {
      if (0xf0 < len) {
        if (seed == 0) {
          auVar72 = vmovdqu64_avx512f(_DAT_001a0c40);
          acc = local_180;
          local_180[0] = vmovdqa64_avx512f(auVar72);
          XXH3_hashLong_internal_loop((xxh_u64 *)acc,(xxh_u8 *)input,len,kSecret,0,in_R9D);
          pxVar55 = kSecret;
        }
        else {
          auVar69 = vpbroadcastq_avx512vl();
          auVar68 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          lVar64 = 0xc;
          auVar85._8_8_ = 0xc;
          auVar85._0_8_ = 0xc;
          auVar85._16_8_ = 0xc;
          auVar85._24_8_ = 0xc;
          auVar87._8_8_ = 4;
          auVar87._0_8_ = 4;
          auVar87._16_8_ = 4;
          auVar87._24_8_ = 4;
          do {
            uVar57 = vpcmpuq_avx512vl(auVar68,auVar85,1);
            uVar57 = uVar57 & 0xf;
            auVar90 = vpsllq_avx2(auVar68,4);
            auVar70 = vpgatherqq_avx512vl(0xbe4ba423396cfeb8);
            auVar71._8_8_ = (ulong)((byte)(uVar57 >> 1) & 1) * auVar70._8_8_;
            auVar71._0_8_ = (ulong)((byte)uVar57 & 1) * auVar70._0_8_;
            auVar71._16_8_ = (ulong)((byte)(uVar57 >> 2) & 1) * auVar70._16_8_;
            auVar71._24_8_ = (uVar57 >> 3) * auVar70._24_8_;
            auVar70 = vpaddq_avx2(auVar71,auVar69);
            vpscatterqq_avx512vl(ZEXT832(local_180) + auVar90,uVar57,auVar70);
            auVar71 = vpgatherqq_avx512vl(0x1cad21f72c81017c);
            auVar70._8_8_ = (ulong)((byte)(uVar57 >> 1) & 1) * auVar71._8_8_;
            auVar70._0_8_ = (ulong)((byte)uVar57 & 1) * auVar71._0_8_;
            auVar70._16_8_ = (ulong)((byte)(uVar57 >> 2) & 1) * auVar71._16_8_;
            auVar70._24_8_ = (uVar57 >> 3) * auVar71._24_8_;
            auVar70 = vpsubq_avx2(auVar70,auVar69);
            vpscatterqq_avx512vl(ZEXT832(local_180) + ZEXT832(8) + auVar90,uVar57,auVar70);
            auVar68 = vpaddq_avx2(auVar68,auVar87);
            lVar64 = lVar64 + -4;
          } while (lVar64 != 0);
          auVar72 = vmovdqu64_avx512f(_DAT_001a0c40);
          acc = local_c0;
          local_c0[0] = vmovdqa64_avx512f(auVar72);
          XXH3_hashLong_internal_loop
                    ((xxh_u64 *)acc,(xxh_u8 *)input,len,(xxh_u8 *)local_180,0,in_R9D);
          pxVar55 = local_180[0];
        }
        XVar56 = XXH3_mergeAccs((xxh_u64 *)acc,pxVar55 + 0xb,len * -0x61c8864e7a143579);
        return XVar56;
      }
      auVar72 = vpbroadcastq_avx512f();
      auVar73 = vmovdqa64_avx512f(kSecret._64_64_);
      auVar74 = vmovdqa64_avx512f(kSecret._0_64_);
      auVar75 = vpmovsxbq_avx512f(ZEXT816(0xf0d0b0907050301));
      auVar76 = vmovdqa64_avx512f(auVar74);
      auVar76 = vpermt2q_avx512f(auVar76,auVar75,auVar73);
      auVar76 = vpsubq_avx512f(auVar76,auVar72);
      auVar77 = vmovdqu64_avx512f(*input);
      auVar78 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)input + 0x40));
      auVar75 = vpermi2q_avx512f(auVar75,auVar77,auVar78);
      auVar75 = vpxorq_avx512f(auVar76,auVar75);
      uVar57 = vpextrq_avx(auVar75._0_16_,1);
      uVar60 = vpextrq_avx(auVar75._16_16_,1);
      auVar76 = vpmovsxbq_avx512f(ZEXT816(0xe0c0a0806040200));
      auVar73 = vpermt2q_avx512f(auVar74,auVar76,auVar73);
      auVar68 = vextracti64x4_avx512f(auVar75,1);
      uVar61 = vpextrq_avx(auVar68._0_16_,1);
      uVar59 = vpextrq_avx(auVar68._16_16_,1);
      auVar73 = vpaddq_avx512f(auVar73,auVar72);
      auVar74 = vpermt2q_avx512f(auVar77,auVar76,auVar78);
      auVar73 = vpxorq_avx512f(auVar73,auVar74);
      uVar63 = vpextrq_avx(auVar73._0_16_,1);
      auVar69 = vextracti64x4_avx512f(auVar73,1);
      uVar65 = vpextrq_avx(auVar69._16_16_,1);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar59;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar65;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = auVar68._16_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = auVar69._16_8_;
      uVar59 = vpextrq_avx(auVar69._0_16_,1);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar61;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar59;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = auVar68._0_8_;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = auVar69._0_8_;
      uVar59 = vpextrq_avx(auVar73._16_16_,1);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar60;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar59;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = auVar75._16_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = auVar73._16_8_;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar57;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar63;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = auVar75._0_8_;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = auVar73._0_8_;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = SUB168(auVar12 * auVar38,8) ^ SUB168(auVar12 * auVar38,0);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = SUB168(auVar13 * auVar39,8) ^ SUB168(auVar13 * auVar39,0);
      auVar4 = vpunpcklqdq_avx(auVar86,auVar84);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = SUB168(auVar14 * auVar40,8) ^ SUB168(auVar14 * auVar40,0);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = SUB168(auVar15 * auVar41,8) ^ SUB168(auVar15 * auVar41,0);
      auVar5 = vpunpcklqdq_avx(auVar91,auVar88);
      auVar68._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
      auVar68._16_16_ = ZEXT116(1) * auVar4;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = SUB168(auVar16 * auVar42,8) ^ SUB168(auVar16 * auVar42,0);
      auVar94._8_8_ = 0;
      auVar94._0_8_ = SUB168(auVar17 * auVar43,8) ^ SUB168(auVar17 * auVar43,0);
      auVar4 = vpunpcklqdq_avx(auVar94,auVar93);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = SUB168(auVar18 * auVar44,8) ^ SUB168(auVar18 * auVar44,0);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = SUB168(auVar19 * auVar45,8) ^ SUB168(auVar19 * auVar45,0);
      auVar5 = vpunpcklqdq_avx(auVar92,auVar89);
      auVar73 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar4,
                                               ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5)),auVar68,1
                          );
      auVar73 = vpaddq_avx512f(ZEXT864(len * -0x61c8864e7a143579),auVar73);
      auVar68 = vextracti64x4_avx512f(auVar73,1);
      auVar73 = vpaddq_avx512f(auVar73,ZEXT3264(auVar68));
      auVar4 = vpaddq_avx(auVar73._0_16_,auVar73._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpaddq_avx(auVar4,auVar5);
      uVar57 = (auVar4._0_8_ >> 0x25 ^ auVar4._0_8_) * 0x165667919e3779f9;
      uVar57 = uVar57 >> 0x20 ^ uVar57;
      if (0x8f < len) {
        uVar58 = (uint)(len >> 4) & 0xfffffff;
        uVar59 = 9;
        if (9 < uVar58) {
          uVar59 = (ulong)uVar58;
        }
        uVar60 = uVar59 - 1 & 0xfffffffffffffff8;
        uVar59 = uVar59 - 9;
        auVar78 = ZEXT864(uVar57);
        auVar73 = vpbroadcastq_avx512f();
        auVar74 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        uVar57 = 0;
        auVar75 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar76 = vpbroadcastq_avx512f();
        auVar77 = vpbroadcastq_avx512f(ZEXT816(8));
        do {
          auVar79 = vpbroadcastq_avx512f();
          auVar79 = vporq_avx512f(auVar79,auVar75);
          uVar61 = vpcmpuq_avx512f(auVar79,auVar73,2);
          auVar79 = vpsllq_avx512f(auVar74,4);
          vpaddq_avx512f(auVar76,auVar79);
          auVar79 = vpgatherqq_avx512f(*(undefined8 *)((long)input + uVar59));
          bVar1 = (byte)uVar61;
          auVar82._8_8_ = (ulong)((byte)(uVar61 >> 1) & 1) * auVar79._8_8_;
          auVar82._0_8_ = (ulong)(bVar1 & 1) * auVar79._0_8_;
          auVar82._16_8_ = (ulong)((byte)(uVar61 >> 2) & 1) * auVar79._16_8_;
          auVar82._24_8_ = (ulong)((byte)(uVar61 >> 3) & 1) * auVar79._24_8_;
          auVar82._32_8_ = (ulong)((byte)(uVar61 >> 4) & 1) * auVar79._32_8_;
          auVar82._40_8_ = (ulong)((byte)(uVar61 >> 5) & 1) * auVar79._40_8_;
          auVar82._48_8_ = (ulong)((byte)(uVar61 >> 6) & 1) * auVar79._48_8_;
          auVar82._56_8_ = (uVar61 >> 7) * auVar79._56_8_;
          auVar80 = vpgatherqq_avx512f(*(undefined8 *)((long)input + uVar59 + 8));
          auVar79._8_8_ = (ulong)((byte)(uVar61 >> 1) & 1) * auVar80._8_8_;
          auVar79._0_8_ = (ulong)(bVar1 & 1) * auVar80._0_8_;
          auVar79._16_8_ = (ulong)((byte)(uVar61 >> 2) & 1) * auVar80._16_8_;
          auVar79._24_8_ = (ulong)((byte)(uVar61 >> 3) & 1) * auVar80._24_8_;
          auVar79._32_8_ = (ulong)((byte)(uVar61 >> 4) & 1) * auVar80._32_8_;
          auVar79._40_8_ = (ulong)((byte)(uVar61 >> 5) & 1) * auVar80._40_8_;
          auVar79._48_8_ = (ulong)((byte)(uVar61 >> 6) & 1) * auVar80._48_8_;
          auVar79._56_8_ = (uVar61 >> 7) * auVar80._56_8_;
          auVar80 = vpgatherqq_avx512f(*(undefined8 *)(uVar60 - 0x7d));
          auVar81._8_8_ = (ulong)((byte)(uVar61 >> 1) & 1) * auVar80._8_8_;
          auVar81._0_8_ = (ulong)(bVar1 & 1) * auVar80._0_8_;
          auVar81._16_8_ = (ulong)((byte)(uVar61 >> 2) & 1) * auVar80._16_8_;
          auVar81._24_8_ = (ulong)((byte)(uVar61 >> 3) & 1) * auVar80._24_8_;
          auVar81._32_8_ = (ulong)((byte)(uVar61 >> 4) & 1) * auVar80._32_8_;
          auVar81._40_8_ = (ulong)((byte)(uVar61 >> 5) & 1) * auVar80._40_8_;
          auVar81._48_8_ = (ulong)((byte)(uVar61 >> 6) & 1) * auVar80._48_8_;
          auVar81._56_8_ = (uVar61 >> 7) * auVar80._56_8_;
          auVar80 = vpaddq_avx512f(auVar81,auVar72);
          auVar82 = vpxorq_avx512f(auVar80,auVar82);
          auVar80 = vpgatherqq_avx512f(*(undefined8 *)(uVar60 - 0x75));
          auVar83._8_8_ = (ulong)((byte)(uVar61 >> 1) & 1) * auVar80._8_8_;
          auVar83._0_8_ = (ulong)(bVar1 & 1) * auVar80._0_8_;
          auVar83._16_8_ = (ulong)((byte)(uVar61 >> 2) & 1) * auVar80._16_8_;
          auVar83._24_8_ = (ulong)((byte)(uVar61 >> 3) & 1) * auVar80._24_8_;
          auVar83._32_8_ = (ulong)((byte)(uVar61 >> 4) & 1) * auVar80._32_8_;
          auVar83._40_8_ = (ulong)((byte)(uVar61 >> 5) & 1) * auVar80._40_8_;
          auVar83._48_8_ = (ulong)((byte)(uVar61 >> 6) & 1) * auVar80._48_8_;
          auVar83._56_8_ = (uVar61 >> 7) * auVar80._56_8_;
          auVar80 = vpsubq_avx512f(auVar83,auVar72);
          auVar79 = vpxorq_avx512f(auVar80,auVar79);
          uVar62 = vpextrq_avx(auVar82._0_16_,1);
          uVar66 = vpextrq_avx(auVar82._16_16_,1);
          auVar68 = vextracti64x4_avx512f(auVar82,1);
          uVar65 = vpextrq_avx(auVar68._0_16_,1);
          uVar67 = vpextrq_avx(auVar68._16_16_,1);
          uVar63 = vpextrq_avx(auVar79._0_16_,1);
          auVar69 = vextracti64x4_avx512f(auVar79,1);
          uVar59 = vpextrq_avx(auVar69._16_16_,1);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = uVar59;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = uVar67;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = auVar69._16_8_;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = auVar68._16_8_;
          uVar59 = vpextrq_avx(auVar69._0_16_,1);
          auVar22._8_8_ = 0;
          auVar22._0_8_ = uVar59;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar65;
          uVar59 = SUB168(auVar22 * auVar48,8) ^ SUB168(auVar22 * auVar48,0);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = auVar69._0_8_;
          auVar49._8_8_ = 0;
          auVar49._0_8_ = auVar68._0_8_;
          uVar65 = vpextrq_avx(auVar79._16_16_,1);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar65;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar66;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = auVar79._16_8_;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = auVar82._16_8_;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar63;
          auVar52._8_8_ = 0;
          auVar52._0_8_ = uVar62;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = auVar79._0_8_;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = auVar82._0_8_;
          auVar95._8_8_ = 0;
          auVar95._0_8_ = SUB168(auVar20 * auVar46,8) ^ SUB168(auVar20 * auVar46,0);
          auVar96._8_8_ = 0;
          auVar96._0_8_ = SUB168(auVar21 * auVar47,8) ^ SUB168(auVar21 * auVar47,0);
          auVar4 = vpunpcklqdq_avx(auVar96,auVar95);
          auVar97._8_8_ = 0;
          auVar97._0_8_ = uVar59;
          auVar98._8_8_ = 0;
          auVar98._0_8_ = SUB168(auVar23 * auVar49,8) ^ SUB168(auVar23 * auVar49,0);
          auVar5 = vpunpcklqdq_avx(auVar98,auVar97);
          auVar69._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
          auVar69._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
          auVar99._8_8_ = 0;
          auVar99._0_8_ = SUB168(auVar24 * auVar50,8) ^ SUB168(auVar24 * auVar50,0);
          auVar100._8_8_ = 0;
          auVar100._0_8_ = SUB168(auVar25 * auVar51,8) ^ SUB168(auVar25 * auVar51,0);
          auVar4 = vpunpcklqdq_avx(auVar100,auVar99);
          auVar79 = vmovdqa64_avx512f(auVar78);
          auVar101._8_8_ = 0;
          auVar101._0_8_ = SUB168(auVar26 * auVar52,8) ^ SUB168(auVar26 * auVar52,0);
          auVar102._8_8_ = 0;
          auVar102._0_8_ = SUB168(auVar27 * auVar53,8) ^ SUB168(auVar27 * auVar53,0);
          auVar5 = vpunpcklqdq_avx(auVar102,auVar101);
          auVar78 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                                   ZEXT116(1) * auVar4,
                                                   ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5)),
                               auVar69,1);
          auVar78 = vpaddq_avx512f(auVar79,auVar78);
          uVar57 = uVar57 + 8;
          auVar74 = vpaddq_avx512f(auVar74,auVar77);
        } while (uVar60 != uVar57);
        auVar72 = vmovdqa64_avx512f(auVar78);
        auVar73._0_8_ =
             (ulong)(bVar1 & 1) * auVar72._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar79._0_8_;
        bVar2 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar73._8_8_ = (ulong)bVar2 * auVar72._8_8_ | (ulong)!bVar2 * auVar79._8_8_;
        bVar2 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar73._16_8_ = (ulong)bVar2 * auVar72._16_8_ | (ulong)!bVar2 * auVar79._16_8_;
        bVar2 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar73._24_8_ = (ulong)bVar2 * auVar72._24_8_ | (ulong)!bVar2 * auVar79._24_8_;
        bVar2 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar73._32_8_ = (ulong)bVar2 * auVar72._32_8_ | (ulong)!bVar2 * auVar79._32_8_;
        bVar2 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar73._40_8_ = (ulong)bVar2 * auVar72._40_8_ | (ulong)!bVar2 * auVar79._40_8_;
        bVar2 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar73._48_8_ = (ulong)bVar2 * auVar72._48_8_ | (ulong)!bVar2 * auVar79._48_8_;
        auVar73._56_8_ =
             (uVar61 >> 7) * auVar72._56_8_ | (ulong)!SUB81(uVar61 >> 7,0) * auVar79._56_8_;
        auVar68 = vextracti64x4_avx512f(auVar73,1);
        auVar72 = vpaddq_avx512f(auVar73,ZEXT3264(auVar68));
        auVar4 = vpaddq_avx(auVar72._0_16_,auVar72._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpaddq_avx(auVar4,auVar5);
        uVar57 = auVar4._0_8_;
      }
      auVar28._8_8_ = 0;
      auVar28._0_8_ = 0xebd33483acc5ea64 - seed ^ *(ulong *)((long)input + (len - 8));
      auVar54._8_8_ = 0;
      auVar54._0_8_ = seed + 0x7378d9c97e9fc831 ^ *(ulong *)((long)input + (len - 0x10));
      uVar57 = (SUB168(auVar28 * auVar54,8) ^ SUB168(auVar28 * auVar54,0)) + uVar57;
      uVar57 = uVar57 >> 0x25 ^ uVar57;
      goto LAB_0010913d;
    }
    lVar64 = len * -0x61c8864e7a143579;
    if (0x20 < len) {
      if (0x40 < len) {
        if (0x60 < len) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = 0x1d4f0bc7c7bbdcf9 - seed ^ *(ulong *)((long)input + 0x38);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = seed + 0x3f349ce33f76faa8 ^ *(ulong *)((long)input + 0x30);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = 0x647378d9c97e9fc8 - seed ^ *(ulong *)((long)input + (len - 0x38));
          auVar31._8_8_ = 0;
          auVar31._0_8_ = seed + 0x3159b4cd4be0518a ^ *(ulong *)((long)input + (len - 0x40));
          lVar64 = lVar64 + (SUB168(auVar4 * auVar30,8) ^ SUB168(auVar4 * auVar30,0)) +
                   (SUB168(auVar5 * auVar31,8) ^ SUB168(auVar5 * auVar31,0));
        }
        auVar6._8_8_ = 0;
        auVar6._0_8_ = 0xa32e531b8b65d088 - seed ^ *(ulong *)((long)input + 0x28);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = seed + 0xcb00c391bb52283c ^ *(ulong *)((long)input + 0x20);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = 0xd8acdea946ef1938 - seed ^ *(ulong *)((long)input + (len - 0x28));
        auVar33._8_8_ = 0;
        auVar33._0_8_ = seed + 0x4ef90da297486471 ^ *(ulong *)((long)input + (len - 0x30));
        lVar64 = (SUB168(auVar7 * auVar33,8) ^ SUB168(auVar7 * auVar33,0)) +
                 (SUB168(auVar6 * auVar32,8) ^ SUB168(auVar6 * auVar32,0)) + lVar64;
      }
      auVar8._8_8_ = 0;
      auVar8._0_8_ = 0x2172ffcc7dd05a82 - seed ^ *(ulong *)((long)input + 0x18);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = seed + 0x78e5c0cc4ee679cb ^ *(ulong *)((long)input + 0x10);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = 0x4c263a81e69035e0 - seed ^ *(ulong *)((long)input + (len - 0x18));
      auVar35._8_8_ = 0;
      auVar35._0_8_ = seed + 0x8e2443f7744608b8 ^ *(ulong *)((long)input + (len - 0x20));
      lVar64 = (SUB168(auVar9 * auVar35,8) ^ SUB168(auVar9 * auVar35,0)) +
               (SUB168(auVar8 * auVar34,8) ^ SUB168(auVar8 * auVar34,0)) + lVar64;
    }
    auVar10._8_8_ = 0;
    auVar10._0_8_ = 0x1cad21f72c81017c - seed ^ *(ulong *)((long)input + 8);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = seed + 0xbe4ba423396cfeb8 ^ *input;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = 0x1f67b3b7a4a44072 - seed ^ *(ulong *)((long)input + (len - 8));
    auVar37._8_8_ = 0;
    auVar37._0_8_ = seed + 0xdb979083e96dd4de ^ *(ulong *)((long)input + (len - 0x10));
    uVar57 = (SUB168(auVar11 * auVar37,8) ^ SUB168(auVar11 * auVar37,0)) +
             (SUB168(auVar10 * auVar36,8) ^ SUB168(auVar10 * auVar36,0)) + lVar64;
  }
  uVar57 = uVar57 >> 0x25 ^ uVar57;
LAB_0010913d:
  return uVar57 * 0x165667919e3779f9 >> 0x20 ^ uVar57 * 0x165667919e3779f9;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t
XXH3_64bits_withSeed(const void* input, size_t len, XXH64_hash_t seed)
{
    if (len <= 16) return XXH3_len_0to16_64b((const xxh_u8*)input, len, kSecret, seed);
    if (len <= 128) return XXH3_len_17to128_64b((const xxh_u8*)input, len, kSecret, sizeof(kSecret), seed);
    if (len <= XXH3_MIDSIZE_MAX) return XXH3_len_129to240_64b((const xxh_u8*)input, len, kSecret, sizeof(kSecret), seed);
    return XXH3_hashLong_64b_withSeed((const xxh_u8*)input, len, seed);
}